

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

ssize_t uv__fs_try_copy_file_range(int in_fd,off_t_conflict *off,int out_fd,size_t len)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  ssize_t r;
  size_t len_local;
  int out_fd_local;
  off_t_conflict *off_local;
  int in_fd_local;
  
  if (uv__fs_try_copy_file_range::no_copy_file_range_support != 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x26;
    return -1;
  }
  sVar3 = uv__fs_copy_file_range(in_fd,off,out_fd,(off_t_conflict *)0x0,len,0);
  if (sVar3 != -1) {
    return sVar3;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  if (iVar1 == 1) {
    iVar1 = uv__is_cifs_or_smb(out_fd);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      *piVar2 = 0x26;
    }
  }
  else if (iVar1 == 0xd) {
    iVar1 = uv__is_buggy_cephfs(in_fd);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      *piVar2 = 0x26;
    }
  }
  else {
    if (iVar1 != 0x12) {
      if (iVar1 == 0x26) {
        uv__fs_try_copy_file_range::no_copy_file_range_support = 1;
        return -1;
      }
      if (iVar1 != 0x5f) {
        return -1;
      }
    }
    piVar2 = __errno_location();
    *piVar2 = 0x26;
  }
  return -1;
}

Assistant:

static ssize_t uv__fs_try_copy_file_range(int in_fd, off_t* off,
                                          int out_fd, size_t len) {
  static _Atomic int no_copy_file_range_support;
  ssize_t r;

  if (atomic_load_explicit(&no_copy_file_range_support, memory_order_relaxed)) {
    errno = ENOSYS;
    return -1;
  }

  r = uv__fs_copy_file_range(in_fd, off, out_fd, NULL, len, 0);

  if (r != -1)
    return r;

  switch (errno) {
  case EACCES:
    /* Pre-4.20 kernels have a bug where CephFS uses the RADOS
     * copy-from command when it shouldn't.
     */
    if (uv__is_buggy_cephfs(in_fd))
      errno = ENOSYS;  /* Use fallback. */
    break;
  case ENOSYS:
    atomic_store_explicit(&no_copy_file_range_support, 1, memory_order_relaxed);
    break;
  case EPERM:
    /* It's been reported that CIFS spuriously fails.
     * Consider it a transient error.
     */
    if (uv__is_cifs_or_smb(out_fd))
      errno = ENOSYS;  /* Use fallback. */
    break;
  case ENOTSUP:
  case EXDEV:
    /* ENOTSUP - it could work on another file system type.
     * EXDEV - it will not work when in_fd and out_fd are not on the same
     *         mounted filesystem (pre Linux 5.3)
     */
    errno = ENOSYS;  /* Use fallback. */
    break;
  }

  return -1;
}